

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** sweeptolive(lua_State *L,GCObject **p,int *n)

{
  GCObject **p_00;
  int iVar1;
  
  iVar1 = 0;
  p_00 = p;
  do {
    iVar1 = iVar1 + 1;
    p_00 = sweeplist(L,p_00,1);
  } while (p_00 == p);
  if (n != (int *)0x0) {
    *n = *n + iVar1;
  }
  return p_00;
}

Assistant:

static GCObject **sweeptolive (lua_State *L, GCObject **p, int *n) {
  GCObject ** old = p;
  int i = 0;
  do {
    i++;
    p = sweeplist(L, p, 1);
  } while (p == old);
  if (n) *n += i;
  return p;
}